

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

int ffputbuf(FILE *ffp,buffer *bp,int eobnl)

{
  line *plVar1;
  size_t sVar2;
  line *lpend;
  line *lp;
  int eobnl_local;
  buffer *bp_local;
  FILE *ffp_local;
  
  plVar1 = bp->b_headp;
  lpend = plVar1->l_fp;
  while( true ) {
    if (lpend == plVar1) {
      if (eobnl != 0) {
        lnewline_at(plVar1->l_bp,plVar1->l_bp->l_used);
        putc((int)*bp->b_nlchr,(FILE *)ffp);
      }
      return 0;
    }
    sVar2 = fwrite(lpend->l_text,1,(long)lpend->l_used,(FILE *)ffp);
    if (sVar2 != (long)lpend->l_used) break;
    if (lpend->l_fp != plVar1) {
      putc((int)*bp->b_nlchr,(FILE *)ffp);
    }
    lpend = lpend->l_fp;
  }
  dobeep();
  ewprintf("Write I/O error");
  return 3;
}

Assistant:

int
ffputbuf(FILE *ffp, struct buffer *bp, int eobnl)
{
	struct line	*lp, *lpend;

	lpend = bp->b_headp;

	for (lp = lforw(lpend); lp != lpend; lp = lforw(lp)) {
		if (fwrite(ltext(lp), 1, llength(lp), ffp) != llength(lp)) {
			dobeep();
			ewprintf("Write I/O error");
			return (FIOERR);
		}
		if (lforw(lp) != lpend)		/* no implied \n on last line */
			putc(*bp->b_nlchr, ffp);
	}
	if (eobnl) {
		lnewline_at(lback(lpend), llength(lback(lpend)));
		putc(*bp->b_nlchr, ffp);
	}
	return (FIOSUC);
}